

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O1

void __thiscall
ninx::parser::element::ForStatement::ForStatement
          (ForStatement *this,string *iterator_name,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *range_expr,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  pointer pcVar1;
  
  (this->super_Statement).super_ASTElement.parent = (Block *)0x0;
  (this->super_Statement).super_ASTElement.__output_block = (Block *)0x0;
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__ForStatement_00207438;
  (this->iterator_name)._M_dataplus._M_p = (pointer)&(this->iterator_name).field_2;
  pcVar1 = (iterator_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->iterator_name,pcVar1,pcVar1 + iterator_name->_M_string_length);
  (this->range_expr)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (range_expr->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (range_expr->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (Expression *)0x0;
  (this->body)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
       (body->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
       .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (body->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = (Block *)0x0;
  return;
}

Assistant:

ninx::parser::element::ForStatement::ForStatement(const std::string &iterator_name, std::unique_ptr<ninx::parser::element::Expression> range_expr,
                                                  std::unique_ptr<ninx::parser::element::Block> body)
        : iterator_name(iterator_name), range_expr(std::move(range_expr)), body(std::move(body)) {}